

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O0

void __thiscall
btSoftColliders::CollideCL_SS::Process(CollideCL_SS *this,btDbvtNode *la,btDbvtNode *lb)

{
  Cluster *p;
  Cluster *p_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  bool *pbVar5;
  undefined8 *puVar6;
  float *pfVar7;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  CJoint *pj;
  CJoint joint;
  sResults res;
  btSoftClusterCollisionShape csb;
  btSoftClusterCollisionShape csa;
  bool connected;
  Cluster *clb;
  Cluster *cla;
  sResults *in_stack_fffffffffffffd00;
  Cluster *in_stack_fffffffffffffd08;
  btSoftClusterCollisionShape *in_stack_fffffffffffffd10;
  btConvexShape *in_stack_fffffffffffffd18;
  CJoint *in_stack_fffffffffffffd20;
  btConvexShape *in_stack_fffffffffffffd28;
  Body local_250;
  Body local_238 [5];
  CJoint *in_stack_fffffffffffffe48;
  sResults *in_stack_fffffffffffffe50;
  ClusterBase *in_stack_fffffffffffffe58;
  Body in_stack_fffffffffffffe70;
  Body in_stack_fffffffffffffe88;
  byte local_29;
  
  p = *(Cluster **)(in_RSI + 0x28);
  p_00 = *(Cluster **)(in_RDX + 0x28);
  local_29 = 0;
  if ((*(long *)(in_RDI + 0x20) == *(long *)(in_RDI + 0x28)) &&
     (iVar3 = btAlignedObjectArray<bool>::size
                        ((btAlignedObjectArray<bool> *)(*(long *)(in_RDI + 0x20) + 0x5f8)),
     iVar3 != 0)) {
    lVar1 = *(long *)(in_RDI + 0x20);
    iVar3 = p->m_clusterIndex;
    iVar4 = btAlignedObjectArray<btSoftBody::Cluster_*>::size
                      ((btAlignedObjectArray<btSoftBody::Cluster_*> *)
                       (*(long *)(in_RDI + 0x20) + 0x5d8));
    pbVar5 = btAlignedObjectArray<bool>::operator[]
                       ((btAlignedObjectArray<bool> *)(lVar1 + 0x5f8),
                        iVar3 + iVar4 * p_00->m_clusterIndex);
    local_29 = *pbVar5 & 1;
  }
  if (local_29 == 0) {
    btSoftClusterCollisionShape::btSoftClusterCollisionShape
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    btSoftClusterCollisionShape::btSoftClusterCollisionShape
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    btGjkEpaSolver2::sResults::sResults((sResults *)in_stack_fffffffffffffd10);
    btTransform::getIdentity();
    btTransform::getIdentity();
    operator-((btVector3 *)in_stack_fffffffffffffd10,(btVector3 *)in_stack_fffffffffffffd08);
    bVar2 = btGjkEpaSolver2::SignedDistance
                      (in_stack_fffffffffffffd28,(btTransform *)in_stack_fffffffffffffd20,
                       in_stack_fffffffffffffd18,(btTransform *)in_stack_fffffffffffffd10,
                       (btVector3 *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    if (bVar2) {
      btSoftBody::CJoint::CJoint(in_stack_fffffffffffffd20);
      btSoftBody::Body::Body(local_238,p);
      btSoftBody::Body::Body(&local_250,p_00);
      bVar2 = ClusterBase::SolveContact
                        (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                         in_stack_fffffffffffffe70,in_stack_fffffffffffffe88,
                         in_stack_fffffffffffffe48);
      if (bVar2) {
        puVar6 = (undefined8 *)
                 btAlignedAllocInternal
                           ((size_t)local_238[0].m_rigid,(int)((ulong)local_238[0].m_soft >> 0x20));
        puVar6[0x1c] = 0;
        puVar6[0x1d] = 0;
        puVar6[0x1a] = 0;
        puVar6[0x1b] = 0;
        puVar6[0x18] = 0;
        puVar6[0x19] = 0;
        puVar6[0x16] = 0;
        puVar6[0x17] = 0;
        puVar6[0x14] = 0;
        puVar6[0x15] = 0;
        puVar6[0x12] = 0;
        puVar6[0x13] = 0;
        puVar6[0x10] = 0;
        puVar6[0x11] = 0;
        puVar6[0xe] = 0;
        puVar6[0xf] = 0;
        puVar6[0xc] = 0;
        puVar6[0xd] = 0;
        puVar6[10] = 0;
        puVar6[0xb] = 0;
        puVar6[8] = 0;
        puVar6[9] = 0;
        puVar6[6] = 0;
        puVar6[7] = 0;
        puVar6[4] = 0;
        puVar6[5] = 0;
        puVar6[2] = 0;
        puVar6[3] = 0;
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar6[0x1e] = 0;
        btSoftBody::CJoint::CJoint((CJoint *)local_250.m_collisionObject);
        btSoftBody::CJoint::operator=((CJoint *)local_238[0].m_rigid,(CJoint *)local_238[0].m_soft);
        btAlignedObjectArray<btSoftBody::Joint_*>::push_back
                  ((btAlignedObjectArray<btSoftBody::Joint_*> *)local_250.m_soft,
                   (Joint **)local_238[0].m_collisionObject);
        pfVar7 = btMax<float>((float *)(*(long *)(in_RDI + 0x20) + 0x1b4),
                              (float *)(*(long *)(in_RDI + 0x28) + 0x1b4));
        *(float *)((long)puVar6 + 0x5c) = *pfVar7 * *(float *)((long)puVar6 + 0x5c);
        *(float *)(puVar6 + 0xc) =
             ((*(float *)(*(long *)(in_RDI + 0x20) + 0x1c0) +
              *(float *)(*(long *)(in_RDI + 0x28) + 0x1c0)) / 2.0) * *(float *)(puVar6 + 0xc);
      }
      btSoftBody::CJoint::~CJoint((CJoint *)0x28878f);
    }
    btSoftClusterCollisionShape::~btSoftClusterCollisionShape
              ((btSoftClusterCollisionShape *)0x28879c);
    btSoftClusterCollisionShape::~btSoftClusterCollisionShape
              ((btSoftClusterCollisionShape *)0x2887a9);
  }
  else {
    Process::count = Process::count + 1;
  }
  return;
}

Assistant:

void		Process(const btDbvtNode* la,const btDbvtNode* lb)
		{
			btSoftBody::Cluster*		cla=(btSoftBody::Cluster*)la->data;
			btSoftBody::Cluster*		clb=(btSoftBody::Cluster*)lb->data;


			bool connected=false;
			if ((bodies[0]==bodies[1])&&(bodies[0]->m_clusterConnectivity.size()))
			{
				connected = bodies[0]->m_clusterConnectivity[cla->m_clusterIndex+bodies[0]->m_clusters.size()*clb->m_clusterIndex];
			}

			if (!connected)
			{
				btSoftClusterCollisionShape	csa(cla);
				btSoftClusterCollisionShape	csb(clb);
				btGjkEpaSolver2::sResults	res;		
				if(btGjkEpaSolver2::SignedDistance(	&csa,btTransform::getIdentity(),
					&csb,btTransform::getIdentity(),
					cla->m_com-clb->m_com,res))
				{
					btSoftBody::CJoint	joint;
					if(SolveContact(res,cla,clb,joint))
					{
						btSoftBody::CJoint*	pj=new(btAlignedAlloc(sizeof(btSoftBody::CJoint),16)) btSoftBody::CJoint();
						*pj=joint;bodies[0]->m_joints.push_back(pj);
						pj->m_erp	*=	btMax(bodies[0]->m_cfg.kSSHR_CL,bodies[1]->m_cfg.kSSHR_CL);
						pj->m_split	*=	(bodies[0]->m_cfg.kSS_SPLT_CL+bodies[1]->m_cfg.kSS_SPLT_CL)/2;
					}
				}
			} else
			{
				static int count=0;
				count++;
				//printf("count=%d\n",count);
				
			}
		}